

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_stmt_status(sqlite3_stmt *pStmt,int op,int resetFlag)

{
  long lVar1;
  uint in_EAX;
  u32 v;
  undefined8 uStack_18;
  
  if (op == 99) {
    lVar1 = *(long *)pStmt;
    uStack_18._0_4_ = in_EAX;
    if (*(sqlite3_mutex **)(lVar1 + 0x18) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(lVar1 + 0x18));
    }
    uStack_18 = (ulong)(uint)uStack_18;
    *(long *)(lVar1 + 0x2f8) = (long)&uStack_18 + 4;
    sqlite3VdbeDelete((Vdbe *)pStmt);
    *(undefined8 *)(lVar1 + 0x2f8) = 0;
    if (*(sqlite3_mutex **)(lVar1 + 0x18) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(lVar1 + 0x18));
    }
  }
  else {
    uStack_18 = (ulong)*(uint *)(pStmt + (long)op * 4 + 0xd0) << 0x20;
    if (resetFlag != 0) {
      *(undefined4 *)(pStmt + (long)op * 4 + 0xd0) = 0;
    }
  }
  return uStack_18._4_4_;
}

Assistant:

SQLITE_API int sqlite3_stmt_status(sqlite3_stmt *pStmt, int op, int resetFlag){
  Vdbe *pVdbe = (Vdbe*)pStmt;
  u32 v;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !pStmt
   || (op!=SQLITE_STMTSTATUS_MEMUSED && (op<0||op>=ArraySize(pVdbe->aCounter)))
  ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  if( op==SQLITE_STMTSTATUS_MEMUSED ){
    sqlite3 *db = pVdbe->db;
    sqlite3_mutex_enter(db->mutex);
    v = 0;
    db->pnBytesFreed = (int*)&v;
    sqlite3VdbeDelete(pVdbe);
    db->pnBytesFreed = 0;
    sqlite3_mutex_leave(db->mutex);
  }else{
    v = pVdbe->aCounter[op];
    if( resetFlag ) pVdbe->aCounter[op] = 0;
  }
  return (int)v;
}